

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_same_stdout_stderr(void)

{
  int iVar1;
  __uid_t _Var2;
  int extraout_EAX;
  undefined8 uVar3;
  undefined1 *puVar4;
  anon_union_8_2_26168aa3_for_data aVar5;
  __sighandler_t p_Var6;
  uv_process_options_t *puVar7;
  passwd *ppVar8;
  ssize_t sVar9;
  uv_buf_t *buf;
  uv_process_t *puVar10;
  uv_process_t *puVar11;
  code *nread;
  uv_timer_t *puVar12;
  uv_process_options_t *__s;
  uv_stdio_container_t stdio [3];
  uv_pipe_t out;
  uv_pipe_t in;
  uv_write_t write_req;
  undefined1 auStack_b20 [16];
  uv_handle_type uStack_b10;
  undefined4 uStack_b08;
  undefined4 uStack_af8;
  uv_stream_t uStack_ae0;
  anon_union_8_2_26168aa3_for_data aStack_9d8;
  int iStack_9c4;
  uv_stdio_container_t uStack_9c0;
  undefined1 auStack_9a8 [16];
  undefined1 auStack_998 [264];
  undefined1 auStack_890 [440];
  undefined1 auStack_6d8 [192];
  anon_union_8_2_26168aa3_for_data aStack_618;
  uv_process_options_t *puStack_610;
  anon_union_8_2_26168aa3_for_data aStack_608;
  anon_union_8_2_26168aa3_for_data aStack_600;
  anon_union_8_2_26168aa3_for_data aStack_5f8;
  char acStack_5e2 [10];
  anon_union_8_2_26168aa3_for_data aStack_5d8;
  sigset_t sStack_5b8;
  anon_union_8_2_26168aa3_for_data aStack_538;
  undefined1 auStack_530 [16];
  uv_stdio_container_t auStack_520 [2];
  undefined1 auStack_500 [264];
  undefined1 auStack_3f8 [192];
  undefined1 *puStack_338;
  anon_union_8_2_26168aa3_for_data aStack_330;
  undefined1 local_328 [16];
  uv_stdio_container_t local_318;
  undefined4 local_308;
  undefined1 *local_300;
  undefined1 local_2e8 [264];
  undefined1 local_1e0 [264];
  undefined1 local_d8 [192];
  
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e033;
  init_process_options("spawn_helper3",exit_cb);
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e044;
  local_328 = uv_buf_init("TEST",4);
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e052;
  uVar3 = uv_default_loop();
  puVar4 = local_2e8;
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e064;
  uv_pipe_init(uVar3,puVar4,0);
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e069;
  uVar3 = uv_default_loop();
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e07e;
  uv_pipe_init(uVar3,(uv_stream_t *)local_1e0,0);
  options.stdio = &local_318;
  local_318.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  local_308 = 0x21;
  options.stdio_count = 2;
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e0b5;
  local_318.data.stream = (uv_stream_t *)local_1e0;
  local_300 = puVar4;
  uVar3 = uv_default_loop();
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e0c7;
  iVar1 = uv_spawn(uVar3,&process,&options);
  if (iVar1 == 0) {
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e0dd;
    iVar1 = uv_process_kill(&process,0);
    if (iVar1 != 0) goto LAB_0016e1b8;
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e109;
    iVar1 = uv_write(local_d8,local_1e0,local_328,1,write_cb);
    if (iVar1 != 0) goto LAB_0016e1bd;
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e129;
    iVar1 = uv_read_start(local_2e8,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_0016e1c2;
    if (exit_cb_called != 0) goto LAB_0016e1c7;
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e143;
    uVar3 = uv_default_loop();
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e14d;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0016e1cc;
    if (exit_cb_called != 1) goto LAB_0016e1d1;
    if (output[4] != '\0' || output._0_4_ != 0x54534554) goto LAB_0016e1d6;
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e175;
    puVar4 = (undefined1 *)uv_default_loop();
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e189;
    uv_walk(puVar4,close_walk_cb,0);
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e193;
    uv_run(puVar4,0);
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e198;
    uVar3 = uv_default_loop();
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e1a0;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e1b8;
    run_test_spawn_same_stdout_stderr_cold_1();
LAB_0016e1b8:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e1bd;
    run_test_spawn_same_stdout_stderr_cold_2();
LAB_0016e1bd:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e1c2;
    run_test_spawn_same_stdout_stderr_cold_3();
LAB_0016e1c2:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e1c7;
    run_test_spawn_same_stdout_stderr_cold_4();
LAB_0016e1c7:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e1cc;
    run_test_spawn_same_stdout_stderr_cold_5();
LAB_0016e1cc:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e1d1;
    run_test_spawn_same_stdout_stderr_cold_6();
LAB_0016e1d1:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e1d6;
    run_test_spawn_same_stdout_stderr_cold_7();
LAB_0016e1d6:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16e1db;
    run_test_spawn_same_stdout_stderr_cold_8();
  }
  aStack_330.stream = (uv_stream_t *)run_test_spawn_closed_process_io;
  run_test_spawn_same_stdout_stderr_cold_9();
  aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e1fd;
  puStack_338 = puVar4;
  aStack_330.stream = (uv_stream_t *)local_1e0;
  init_process_options("spawn_helper3",exit_cb);
  aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e202;
  uVar3 = uv_default_loop();
  aVar5.stream = (uv_stream_t *)auStack_500;
  aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e214;
  uv_pipe_init(uVar3,aVar5.stream,0);
  options.stdio = auStack_520;
  __s = &options;
  auStack_520[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 1;
  aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e242;
  auStack_520[0].data.stream = aVar5.stream;
  close(0);
  aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e247;
  uVar3 = uv_default_loop();
  aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e259;
  iVar1 = uv_spawn(uVar3,&process,&options);
  if (iVar1 == 0) {
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e272;
    auStack_530 = uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e29d;
    iVar1 = uv_write(auStack_3f8,auStack_500,auStack_530,1,write_cb);
    if (iVar1 != 0) goto LAB_0016e30c;
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e2a6;
    uVar3 = uv_default_loop();
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e2b0;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0016e311;
    if (exit_cb_called != 1) goto LAB_0016e316;
    if (close_cb_called != 2) goto LAB_0016e31b;
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e2cb;
    aVar5.stream = (uv_stream_t *)uv_default_loop();
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e2df;
    uv_walk(aVar5.stream,close_walk_cb,0);
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e2e9;
    uv_run(aVar5.stream,0);
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e2ee;
    uVar3 = uv_default_loop();
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e2f6;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e30c;
    run_test_spawn_closed_process_io_cold_1();
LAB_0016e30c:
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e311;
    run_test_spawn_closed_process_io_cold_2();
LAB_0016e311:
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e316;
    run_test_spawn_closed_process_io_cold_3();
LAB_0016e316:
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e31b;
    run_test_spawn_closed_process_io_cold_4();
LAB_0016e31b:
    aStack_538 = (anon_union_8_2_26168aa3_for_data)0x16e320;
    run_test_spawn_closed_process_io_cold_5();
  }
  aStack_538.stream = (uv_stream_t *)run_test_kill;
  run_test_spawn_closed_process_io_cold_6();
  puVar7 = (uv_process_options_t *)&sStack_5b8;
  aStack_538 = aVar5;
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset(&sStack_5b8);
  sigaddset(&sStack_5b8,0xf);
  iVar1 = pthread_sigmask(0,&sStack_5b8,(__sigset_t *)0x0);
  if (iVar1 == 0) {
    p_Var6 = signal(0xf,(__sighandler_t)0x1);
    if (p_Var6 == (__sighandler_t)0xffffffffffffffff) goto LAB_0016e483;
    uVar3 = uv_default_loop();
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 != 0) goto LAB_0016e488;
    sigemptyset(&sStack_5b8);
    sigaddset(&sStack_5b8,0xf);
    iVar1 = pthread_sigmask(1,&sStack_5b8,(__sigset_t *)0x0);
    if (iVar1 != 0) goto LAB_0016e48d;
    p_Var6 = signal(0xf,(__sighandler_t)0x0);
    if (p_Var6 == (__sighandler_t)0xffffffffffffffff) goto LAB_0016e492;
    iVar1 = uv_kill(process.pid,0);
    if (iVar1 != 0) goto LAB_0016e497;
    iVar1 = uv_kill(process.pid,0xf);
    if (iVar1 != 0) goto LAB_0016e49c;
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0016e4a1;
    if (exit_cb_called != 1) goto LAB_0016e4a6;
    if (close_cb_called != 1) goto LAB_0016e4ab;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    uv_walk(puVar7,close_walk_cb,0);
    uv_run(puVar7,0);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_0016e483:
    run_test_kill_cold_11();
LAB_0016e488:
    run_test_kill_cold_2();
LAB_0016e48d:
    run_test_kill_cold_3();
LAB_0016e492:
    run_test_kill_cold_10();
LAB_0016e497:
    run_test_kill_cold_4();
LAB_0016e49c:
    run_test_kill_cold_5();
LAB_0016e4a1:
    run_test_kill_cold_6();
LAB_0016e4a6:
    run_test_kill_cold_7();
LAB_0016e4ab:
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e4c5;
  aStack_5d8 = (anon_union_8_2_26168aa3_for_data)puVar7;
  _Var2 = getuid();
  if (_Var2 != 0) {
LAB_0016e607:
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e60c;
    run_test_spawn_setuid_setgid_cold_5();
    return 1;
  }
  aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e4e0;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e4ec;
  ppVar8 = getpwnam("nobody");
  if (ppVar8 == (passwd *)0x0) {
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e618;
    run_test_spawn_setuid_setgid_cold_7();
LAB_0016e618:
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e61d;
    run_test_spawn_setuid_setgid_cold_6();
LAB_0016e61d:
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e622;
    run_test_spawn_setuid_setgid_cold_1();
LAB_0016e622:
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e627;
    run_test_spawn_setuid_setgid_cold_2();
LAB_0016e627:
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e62c;
    run_test_spawn_setuid_setgid_cold_3();
  }
  else {
    options.uid = ppVar8->pw_uid;
    puVar7 = &options;
    options.gid = ppVar8->pw_gid;
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e52f;
    snprintf(acStack_5e2,10,"%d");
    __s = (uv_process_options_t *)&stack0xfffffffffffffa14;
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e54a;
    snprintf((char *)__s,10,"%d",(ulong)ppVar8->pw_gid);
    options.args[2] = acStack_5e2;
    options.args[3] = (char *)__s;
    options.flags = 3;
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e56f;
    uVar3 = uv_default_loop();
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e581;
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 != 0) {
      if (iVar1 == -0xd) goto LAB_0016e607;
      goto LAB_0016e618;
    }
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e58a;
    uVar3 = uv_default_loop();
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e594;
    iVar1 = uv_run(uVar3);
    if (iVar1 != 0) goto LAB_0016e61d;
    if (exit_cb_called != 1) goto LAB_0016e622;
    if (close_cb_called != 1) goto LAB_0016e627;
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e5b3;
    __s = (uv_process_options_t *)uv_default_loop();
    puVar7 = (uv_process_options_t *)0x0;
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e5c9;
    uv_walk(__s,close_walk_cb,0);
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e5d3;
    uv_run(__s);
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e5d8;
    uVar3 = uv_default_loop();
    aStack_5f8 = (anon_union_8_2_26168aa3_for_data)0x16e5e0;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  aStack_5f8.stream = (uv_stream_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_4();
  aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e637;
  aStack_5f8 = (anon_union_8_2_26168aa3_for_data)puVar7;
  _Var2 = getuid();
  if (_Var2 == 0) {
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e647;
    aVar5.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar5.stream == (uv_stream_t *)0x0) goto LAB_0016e722;
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e65b;
    iVar1 = setgid(*(__gid_t *)&(aVar5.stream)->field_0x14);
    puVar7 = (uv_process_options_t *)aVar5.stream;
    if (iVar1 != 0) goto LAB_0016e727;
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e66b;
    iVar1 = setuid((aVar5.stream)->type);
    if (iVar1 == 0) goto LAB_0016e673;
  }
  else {
LAB_0016e673:
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e686;
    init_process_options("spawn_helper1",fail_cb);
    puVar7 = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e6a3;
    uVar3 = uv_default_loop();
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e6b5;
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 == -1) {
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e6bf;
      uVar3 = uv_default_loop();
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e6c9;
      iVar1 = uv_run(uVar3);
      if (iVar1 != 0) goto LAB_0016e713;
      if (close_cb_called != 0) goto LAB_0016e718;
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e6db;
      puVar7 = (uv_process_options_t *)uv_default_loop();
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e6ef;
      uv_walk(puVar7,close_walk_cb,0);
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e6f9;
      uv_run(puVar7);
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e6fe;
      uVar3 = uv_default_loop();
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e706;
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e713;
      run_test_spawn_setuid_fails_cold_3();
LAB_0016e713:
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e718;
      run_test_spawn_setuid_fails_cold_4();
LAB_0016e718:
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e71d;
      run_test_spawn_setuid_fails_cold_5();
    }
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e722;
    run_test_spawn_setuid_fails_cold_6();
LAB_0016e722:
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e727;
    run_test_spawn_setuid_fails_cold_7();
LAB_0016e727:
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16e72c;
    run_test_spawn_setuid_fails_cold_1();
  }
  aStack_600.stream = (uv_stream_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e737;
  aStack_600 = (anon_union_8_2_26168aa3_for_data)puVar7;
  _Var2 = getuid();
  if (_Var2 == 0) {
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e747;
    aVar5.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar5.stream == (uv_stream_t *)0x0) goto LAB_0016e822;
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e75b;
    iVar1 = setgid(*(__gid_t *)&(aVar5.stream)->field_0x14);
    puVar7 = (uv_process_options_t *)aVar5.stream;
    if (iVar1 != 0) goto LAB_0016e827;
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e76b;
    iVar1 = setuid((aVar5.stream)->type);
    if (iVar1 == 0) goto LAB_0016e773;
  }
  else {
LAB_0016e773:
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e786;
    init_process_options("spawn_helper1",fail_cb);
    puVar7 = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e7a3;
    uVar3 = uv_default_loop();
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e7b5;
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 == -1) {
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e7bf;
      uVar3 = uv_default_loop();
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e7c9;
      iVar1 = uv_run(uVar3);
      if (iVar1 != 0) goto LAB_0016e813;
      if (close_cb_called != 0) goto LAB_0016e818;
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e7db;
      puVar7 = (uv_process_options_t *)uv_default_loop();
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e7ef;
      uv_walk(puVar7,close_walk_cb,0);
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e7f9;
      uv_run(puVar7);
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e7fe;
      uVar3 = uv_default_loop();
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e806;
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e813;
      run_test_spawn_setgid_fails_cold_3();
LAB_0016e813:
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e818;
      run_test_spawn_setgid_fails_cold_4();
LAB_0016e818:
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e81d;
      run_test_spawn_setgid_fails_cold_5();
    }
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e822;
    run_test_spawn_setgid_fails_cold_6();
LAB_0016e822:
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e827;
    run_test_spawn_setgid_fails_cold_7();
LAB_0016e827:
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16e82c;
    run_test_spawn_setgid_fails_cold_1();
  }
  aStack_608.stream = (uv_stream_t *)run_test_spawn_auto_unref;
  run_test_spawn_setgid_fails_cold_2();
  puStack_610 = (uv_process_options_t *)0x16e840;
  aStack_608 = (anon_union_8_2_26168aa3_for_data)puVar7;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_610 = (uv_process_options_t *)0x16e845;
  uVar3 = uv_default_loop();
  puStack_610 = (uv_process_options_t *)0x16e85b;
  iVar1 = uv_spawn(uVar3,&process,&options);
  if (iVar1 == 0) {
    puStack_610 = (uv_process_options_t *)0x16e868;
    uVar3 = uv_default_loop();
    puStack_610 = (uv_process_options_t *)0x16e872;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0016e8f5;
    puStack_610 = (uv_process_options_t *)0x16e882;
    iVar1 = uv_is_closing(&process);
    if (iVar1 != 0) goto LAB_0016e8fa;
    puStack_610 = (uv_process_options_t *)0x16e894;
    uv_close(&process,0);
    puStack_610 = (uv_process_options_t *)0x16e899;
    uVar3 = uv_default_loop();
    puStack_610 = (uv_process_options_t *)0x16e8a3;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0016e8ff;
    puStack_610 = (uv_process_options_t *)0x16e8b3;
    iVar1 = uv_is_closing(&process);
    if (iVar1 != 1) goto LAB_0016e904;
    puStack_610 = (uv_process_options_t *)0x16e8bd;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    puStack_610 = (uv_process_options_t *)0x16e8d1;
    uv_walk(puVar7,close_walk_cb,0);
    puStack_610 = (uv_process_options_t *)0x16e8db;
    uv_run(puVar7,0);
    puStack_610 = (uv_process_options_t *)0x16e8e0;
    uVar3 = uv_default_loop();
    puStack_610 = (uv_process_options_t *)0x16e8e8;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_610 = (uv_process_options_t *)0x16e8f5;
    run_test_spawn_auto_unref_cold_1();
LAB_0016e8f5:
    puStack_610 = (uv_process_options_t *)0x16e8fa;
    run_test_spawn_auto_unref_cold_2();
LAB_0016e8fa:
    puStack_610 = (uv_process_options_t *)0x16e8ff;
    run_test_spawn_auto_unref_cold_3();
LAB_0016e8ff:
    puStack_610 = (uv_process_options_t *)0x16e904;
    run_test_spawn_auto_unref_cold_4();
LAB_0016e904:
    puStack_610 = (uv_process_options_t *)0x16e909;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_610 = (uv_process_options_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  nread = (code *)auStack_890;
  aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16e939;
  aStack_618 = (anon_union_8_2_26168aa3_for_data)puVar7;
  puStack_610 = __s;
  iStack_9c4 = uv_fs_open(0,nread,"/dev/null",2,0,0);
  if (iStack_9c4 < 0) {
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16ea96;
    run_test_spawn_fs_open_cold_1();
LAB_0016ea96:
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16ea9b;
    run_test_spawn_fs_open_cold_2();
LAB_0016ea9b:
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16eaa0;
    run_test_spawn_fs_open_cold_3();
LAB_0016eaa0:
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16eaa5;
    run_test_spawn_fs_open_cold_4();
LAB_0016eaa5:
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16eaaa;
    run_test_spawn_fs_open_cold_5();
LAB_0016eaaa:
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16eaaf;
    run_test_spawn_fs_open_cold_6();
LAB_0016eaaf:
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16eab4;
    run_test_spawn_fs_open_cold_7();
LAB_0016eab4:
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16eab9;
    run_test_spawn_fs_open_cold_8();
  }
  else {
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16e952;
    uv_fs_req_cleanup(auStack_890);
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16e965;
    init_process_options("spawn_helper8",exit_cb);
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16e96a;
    uVar3 = uv_default_loop();
    puVar7 = (uv_process_options_t *)auStack_998;
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16e97c;
    nread = (code *)puVar7;
    iVar1 = uv_pipe_init(uVar3,puVar7,0);
    if (iVar1 != 0) goto LAB_0016ea96;
    options.stdio = &uStack_9c0;
    uStack_9c0.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16e9b0;
    uStack_9c0.data.stream = (uv_stream_t *)puVar7;
    uVar3 = uv_default_loop();
    puVar10 = &process;
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16e9c2;
    iVar1 = uv_spawn(uVar3,&process,&options);
    nread = (code *)puVar10;
    if (iVar1 != 0) goto LAB_0016ea9b;
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16e9d9;
    auStack_9a8 = uv_buf_init(&iStack_9c4,4);
    nread = (code *)auStack_998;
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16ea06;
    iVar1 = uv_write(auStack_6d8,nread,auStack_9a8,1,write_cb);
    if (iVar1 != 0) goto LAB_0016eaa0;
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16ea13;
    uVar3 = uv_default_loop();
    nread = (code *)0x0;
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16ea1d;
    iVar1 = uv_run(uVar3);
    if (iVar1 != 0) goto LAB_0016eaa5;
    nread = (code *)auStack_890;
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16ea3a;
    iVar1 = uv_fs_close(0,nread,iStack_9c4,0);
    if (iVar1 != 0) goto LAB_0016eaaa;
    if (exit_cb_called != 1) goto LAB_0016eaaf;
    if (close_cb_called != 2) goto LAB_0016eab4;
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16ea55;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16ea69;
    uv_walk(puVar7,close_walk_cb,0);
    nread = (code *)0x0;
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16ea73;
    uv_run(puVar7);
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16ea78;
    uVar3 = uv_default_loop();
    aStack_9d8 = (anon_union_8_2_26168aa3_for_data)0x16ea80;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  aStack_9d8.stream = (uv_stream_t *)run_test_closed_fd_events;
  run_test_spawn_fs_open_cold_9();
  puVar10 = (uv_process_t *)auStack_b20;
  aStack_9d8 = (anon_union_8_2_26168aa3_for_data)puVar7;
  iVar1 = pipe((int *)puVar10);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = (uv_stdio_container_t *)(auStack_b20 + 8);
    auStack_b20._8_4_ = 2;
    uStack_b10 = auStack_b20._0_4_;
    uStack_b08 = 0;
    uStack_af8 = 0;
    puVar10 = (uv_process_t *)uv_default_loop();
    puVar11 = &process;
    iVar1 = uv_spawn(puVar10,&process,&options);
    nread = (code *)puVar11;
    if (iVar1 != 0) goto LAB_0016ed02;
    uv_unref(&process);
    puVar10 = (uv_process_t *)uv_default_loop();
    nread = (code *)&uStack_ae0;
    iVar1 = uv_pipe_init(puVar10,nread,0);
    if (iVar1 != 0) goto LAB_0016ed07;
    nread._4_4_ = 0;
    nread._0_4_ = auStack_b20._0_4_;
    puVar10 = (uv_process_t *)&uStack_ae0;
    iVar1 = uv_pipe_open();
    if (iVar1 != 0) goto LAB_0016ed0c;
    auStack_b20._0_4_ = ~UV_UNKNOWN_HANDLE;
    nread = on_alloc;
    puVar10 = (uv_process_t *)&uStack_ae0;
    iVar1 = uv_read_start(puVar10,on_alloc,on_read_once);
    if (iVar1 != 0) goto LAB_0016ed11;
    puVar10 = (uv_process_t *)(ulong)(uint)auStack_b20._4_4_;
    nread = (code *)0x1802fd;
    sVar9 = write(auStack_b20._4_4_,"",1);
    if (sVar9 != 1) goto LAB_0016ed16;
    puVar10 = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0016ed1b;
    if (output_used != 1) goto LAB_0016ed20;
    uv_close(&uStack_ae0,close_cb);
    puVar10 = (uv_process_t *)(ulong)(uint)auStack_b20._4_4_;
    nread = (code *)0x1802fd;
    sVar9 = write(auStack_b20._4_4_,"",1);
    if (sVar9 != 1) goto LAB_0016ed25;
    puVar10 = (uv_process_t *)uv_default_loop();
    puVar12 = &timer;
    iVar1 = uv_timer_init();
    nread = (code *)puVar12;
    if (iVar1 != 0) goto LAB_0016ed2a;
    puVar12 = &timer;
    nread = timer_counter_cb;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    puVar10 = (uv_process_t *)puVar12;
    if (iVar1 != 0) goto LAB_0016ed2f;
    puVar10 = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar1 = uv_run();
    if (iVar1 == 1) {
      puVar10 = (uv_process_t *)uv_default_loop();
      nread = (code *)0x1;
      iVar1 = uv_run();
      if (iVar1 != 0) goto LAB_0016ed48;
    }
    if (timer_counter != 1) goto LAB_0016ed34;
    puVar10 = &process;
    nread = (code *)0xf;
    iVar1 = uv_process_kill();
    if (iVar1 != 0) goto LAB_0016ed39;
    puVar10 = (uv_process_t *)(ulong)(uint)auStack_b20._4_4_;
    iVar1 = close(auStack_b20._4_4_);
    if (iVar1 != 0) goto LAB_0016ed3e;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    nread = (code *)0x0;
    uv_run(uVar3);
    puVar10 = (uv_process_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_0016ed02:
    run_test_closed_fd_events_cold_2();
LAB_0016ed07:
    run_test_closed_fd_events_cold_3();
LAB_0016ed0c:
    run_test_closed_fd_events_cold_4();
LAB_0016ed11:
    run_test_closed_fd_events_cold_5();
LAB_0016ed16:
    run_test_closed_fd_events_cold_6();
LAB_0016ed1b:
    run_test_closed_fd_events_cold_7();
LAB_0016ed20:
    run_test_closed_fd_events_cold_8();
LAB_0016ed25:
    run_test_closed_fd_events_cold_9();
LAB_0016ed2a:
    run_test_closed_fd_events_cold_10();
LAB_0016ed2f:
    run_test_closed_fd_events_cold_11();
LAB_0016ed34:
    run_test_closed_fd_events_cold_13();
LAB_0016ed39:
    run_test_closed_fd_events_cold_14();
LAB_0016ed3e:
    run_test_closed_fd_events_cold_15();
  }
  run_test_closed_fd_events_cold_16();
LAB_0016ed48:
  run_test_closed_fd_events_cold_12();
  uv_read_stop();
  on_read((uv_stream_t *)puVar10,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_same_stdout_stderr) {
  uv_write_t write_req;
  uv_pipe_t in, out;
  uv_buf_t buf;
  uv_stdio_container_t stdio[3];
  int r;

  init_process_options("spawn_helper3", exit_cb);
  buf = uv_buf_init("TEST", 4);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*)&in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*)&out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  /* Sending signum == 0 should check if the
   * child process is still alive, not kill it.
   */
  r = uv_process_kill(&process, 0);
  ASSERT(r == 0);

  r = uv_write(&write_req, (uv_stream_t*)&in, &buf, 1, write_cb);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*)&out, on_alloc, on_read);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(strcmp(output, "TEST") == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}